

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
Parser::parseMetadata(Parser *this,QString *data,qsizetype offset,QStringList *includes)

{
  undefined1 *puVar1;
  QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate> QVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  QRegularExpressionMatchIterator QVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  qsizetype qVar13;
  QString *pQVar14;
  iterator iVar15;
  iterator iVar16;
  pointer pQVar17;
  iterator iVar18;
  long lVar19;
  QString *str;
  QString *str_00;
  QList<QString> *this_00;
  QString *pQVar20;
  Parser *pPVar21;
  Function *pFVar22;
  char *pcVar23;
  long lVar24;
  iterator __i;
  iterator s1;
  EnumNameValue *pEVar25;
  long in_FS_OFFSET;
  long local_288;
  QArrayDataPointer<char16_t> local_260;
  QArrayDataPointer<char16_t> local_248;
  QArrayDataPointer<char16_t> local_230;
  QArrayDataPointer<char16_t> local_218;
  QArrayDataPointer<char16_t> local_200;
  QArrayDataPointer<EnumNameValue> local_1e8;
  QArrayDataPointer<QString> local_1c8;
  undefined1 local_1a8 [32];
  QRegularExpressionMatch rm;
  Data *local_168;
  QString *pQStack_160;
  QString *local_158;
  Data *local_148;
  QString *pQStack_140;
  undefined1 *local_138;
  QRegularExpressionMatch match;
  QRegularExpressionMatchIterator i;
  QRegularExpression macro;
  Data *local_118;
  QString *pQStack_110;
  undefined1 *local_108;
  Data *local_f8;
  char16_t *pcStack_f0;
  undefined1 *local_e8;
  QArrayDataPointer<char16_t> local_d8;
  QRegularExpression rangeMacro;
  Function *pFStack_b0;
  undefined1 *local_a8;
  QRegularExpressionMatchIterator r;
  Function *pFStack_90;
  undefined1 *local_88;
  QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate> local_78;
  char16_t *pcStack_70;
  undefined1 *local_68;
  Data *pDStack_60;
  Point *local_58;
  qsizetype qStack_50;
  Data *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar11 = QString::indexOf(data,(QChar)0x28,offset,CaseSensitive);
  uVar12 = QString::indexOf(data,(QChar)0x2c,uVar11,CaseSensitive);
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (char16_t *)0x0;
  local_d8.size = 0;
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  local_f8 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  pcStack_f0 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::mid((QString *)&stack0xffffffffffffff88,data,uVar11 + 1,~uVar11 + uVar12);
  QString::simplified_helper
            ((QString *)&stack0xffffffffffffff08,(QString *)&stack0xffffffffffffff88,str);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff88);
  bVar7 = operator!=((QString *)&stack0xffffffffffffff08,&this->m_provider);
  if (!bVar7) {
    qVar13 = QString::indexOf(data,(QChar)0x29,uVar12 + 1,CaseSensitive);
    QString::mid((QString *)&r,data,uVar12 + 1,~uVar12 + qVar13);
    QString::simplified_helper((QString *)&stack0xffffffffffffff88,(QString *)&r,str_00);
    qVar13 = local_d8.size;
    pcVar4 = local_d8.ptr;
    pDVar3 = local_d8.d;
    local_d8.d = (Data *)local_78.d.ptr;
    local_d8.ptr = pcStack_70;
    local_78.d.ptr =
         (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)
         (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)pDVar3;
    pcStack_70 = pcVar4;
    local_d8.size = (qsizetype)local_68;
    local_68 = (undefined1 *)qVar13;
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&r);
    local_108 = &DAT_aaaaaaaaaaaaaaaa;
    local_118 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    pQStack_110 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    preprocessMetadata((QString *)&stack0xfffffffffffffee8,(QString *)&local_d8);
    local_78.d.ptr =
         (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)
         (QRegularExpressionMatchIteratorPrivate *)0x0;
    macro.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    r.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
                (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)0x0;
    pcStack_70 = L"([A-Z]*) ?{ ?([A-Za-z0-9=_,. ]*) ?} ?([A-Za-z0-9_:]*) ?;";
    local_68 = (undefined1 *)0x38;
    QRegularExpression::QRegularExpression
              (&macro,(QString *)&stack0xffffffffffffff88,(PatternOptions)0x0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&r);
    i.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
                &DAT_aaaaaaaaaaaaaaaa;
    QRegularExpression::globalMatch
              ((QRegularExpression *)&i,(QString *)&macro,(qsizetype)&stack0xfffffffffffffee8,
               NormalMatch,(MatchOptions)0x0);
    this_00 = &this->m_metadata;
    local_288 = 0;
    while( true ) {
      bVar7 = QRegularExpressionMatchIterator::hasNext(&i);
      if (!bVar7) break;
      match.d.d.ptr =
           (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QRegularExpressionMatchIterator::next((QRegularExpressionMatchIterator *)&match);
      local_138 = &DAT_aaaaaaaaaaaaaaaa;
      local_148 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      pQStack_140 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      QRegularExpressionMatch::captured((QString *)&stack0xffffffffffffff88,&match,2);
      QString::trimmed_helper
                ((QString *)&stack0xfffffffffffffeb8,(QString *)&stack0xffffffffffffff88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff88);
      qVar13 = QRegularExpressionMatch::capturedStart(&match,0);
      lVar19 = (int)qVar13 - local_288;
      if (lVar19 != 0 && local_288 <= (int)qVar13) {
        QString::mid((QString *)&stack0xffffffffffffff88,(QString *)&stack0xfffffffffffffee8,
                     local_288,lVar19);
        QList<QString>::emplaceBack<QString>(this_00,(QString *)&stack0xffffffffffffff88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff88);
      }
      qVar13 = QRegularExpressionMatch::capturedEnd(&match,0);
      if (local_138 == (undefined1 *)0x0) {
LAB_00107e1b:
        QString::replace((QString *)&stack0xfffffffffffffeb8,(QChar)0xa,(QChar)0x20,CaseSensitive);
        local_168 = (Data *)0x0;
        pQStack_160 = (QString *)0x0;
        local_158 = (QString *)0x0;
        r.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
                    (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)0x0;
        local_78.d.ptr =
             (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)
             (QRegularExpressionMatchIteratorPrivate *)0x0;
        pcStack_70 = L"RANGE";
        local_68 = (undefined1 *)0x5;
        bVar7 = QString::contains((QString *)&stack0xfffffffffffffeb8,
                                  (QString *)&stack0xffffffffffffff88,CaseSensitive);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&r);
        if (bVar7) {
          rangeMacro.d.d.ptr =
               (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)&DAT_aaaaaaaaaaaaaaaa;
          r.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
                      (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)0x0;
          local_78.d.ptr =
               (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)
               (QRegularExpressionMatchIteratorPrivate *)0x0;
          pcStack_70 = L"RANGE +([A-Za-z0-9_]*) +... +([A-Za-z0-9_]*)";
          local_68 = (undefined1 *)0x2c;
          QRegularExpression::QRegularExpression
                    (&rangeMacro,(QString *)&stack0xffffffffffffff88,(PatternOptions)0x0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&r);
          r.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
                      &DAT_aaaaaaaaaaaaaaaa;
          QRegularExpression::globalMatch
                    ((QRegularExpression *)&r,(QString *)&rangeMacro,
                     (qsizetype)&stack0xfffffffffffffeb8,NormalMatch,(MatchOptions)0x0);
          while (bVar7 = QRegularExpressionMatchIterator::hasNext(&r), bVar7) {
            rm.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
                         &DAT_aaaaaaaaaaaaaaaa;
            QRegularExpressionMatchIterator::next((QRegularExpressionMatchIterator *)&rm);
            QRegularExpressionMatch::captured((QString *)&stack0xffffffffffffff88,&rm,1);
            QList<QString>::emplaceBack<QString>
                      ((QList<QString> *)&stack0xfffffffffffffe98,
                       (QString *)&stack0xffffffffffffff88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff88);
            QRegularExpressionMatch::captured((QString *)&stack0xffffffffffffff88,&rm,2);
            QList<QString>::emplaceBack<QString>
                      ((QList<QString> *)&stack0xfffffffffffffe98,
                       (QString *)&stack0xffffffffffffff88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff88);
            QRegularExpressionMatch::~QRegularExpressionMatch(&rm);
          }
          QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator(&r);
          QRegularExpression::~QRegularExpression(&rangeMacro);
        }
        rm.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
                     &DAT_aaaaaaaaaaaaaaaa;
        QRegularExpressionMatch::captured((QString *)&rm,&match,1);
        local_1a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_1a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_1a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QRegularExpressionMatch::captured((QString *)local_1a8,&match,3);
        r.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
                    (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)0x0;
        pFStack_90 = (Function *)0x0;
        local_78.d.ptr =
             (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)
             (QRegularExpressionMatchIteratorPrivate *)0x0;
        pcStack_70 = L"FLAGS";
        local_88 = (undefined1 *)0x0;
        local_68 = (undefined1 *)0x5;
        pPVar21 = (Parser *)&stack0xffffffffffffff88;
        bVar7 = comparesEqual((QString *)&rm,(QString *)&stack0xffffffffffffff88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&r);
        local_1c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_1c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_1c8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        findEnumValues((QStringList *)&local_1c8,pPVar21,(QString *)local_1a8,includes);
        if ((undefined1 *)local_1c8.size == (undefined1 *)0x0) {
          if (bVar7) {
            bVar8 = QString::endsWith((QString *)local_1a8,(QChar)0x73,CaseSensitive);
            if (bVar8) {
              pPVar21 = (Parser *)local_1a8;
              QString::left((QString *)&r,(QString *)pPVar21,(qsizetype)(local_1a8._16_8_ + -1));
              findEnumValues((QStringList *)&stack0xffffffffffffff88,pPVar21,(QString *)&r,includes)
              ;
              QArrayDataPointer<QString>::operator=
                        (&local_1c8,(QArrayDataPointer<QString> *)&stack0xffffffffffffff88);
              QArrayDataPointer<QString>::~QArrayDataPointer
                        ((QArrayDataPointer<QString> *)&stack0xffffffffffffff88);
              QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&r);
            }
            if ((undefined1 *)local_1c8.size != (undefined1 *)0x0) goto LAB_001080e9;
          }
        }
        else {
LAB_001080e9:
          local_1e8.d = (Data *)0x0;
          local_1e8.ptr = (EnumNameValue *)0x0;
          local_1e8.size = 0;
          pQVar14 = local_1c8.ptr + local_1c8.size;
          iVar10 = 0;
          for (pQVar20 = local_1c8.ptr; pQVar20 != pQVar14; pQVar20 = pQVar20 + 1) {
            local_48 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_78.d.ptr =
                 (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)
                 (QRegularExpressionMatchIteratorPrivate *)0x0;
            pcStack_70 = (char16_t *)0x0;
            local_68 = (undefined1 *)0x0;
            pDStack_60 = (Data *)0x0;
            local_58 = (Point *)0x0;
            qStack_50 = 0;
            bVar8 = QString::contains(pQVar20,(QChar)0x3d,CaseSensitive);
            if (bVar8) {
              uVar11 = QString::indexOf(pQVar20,(QChar)0x3d,0,CaseSensitive);
              QString::left((QString *)&rangeMacro,pQVar20,uVar11);
              QString::trimmed_helper((QString *)&r,(QString *)&rangeMacro);
              QVar2.d.ptr = local_78.d.ptr;
              local_78.d.ptr =
                   (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)
                   (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)r.d.d.ptr;
              pcStack_70 = (char16_t *)pFStack_90;
              r.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
                          (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
                          QVar2.d.ptr;
              local_68 = local_88;
              QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&r);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&rangeMacro);
              local_88 = &DAT_aaaaaaaaaaaaaaaa;
              r.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
                          &DAT_aaaaaaaaaaaaaaaa;
              pFStack_90 = (Function *)&DAT_aaaaaaaaaaaaaaaa;
              QString::right((QString *)&rangeMacro,pQVar20,~uVar11 + (pQVar20->d).size);
              QString::trimmed_helper((QString *)&r,(QString *)&rangeMacro);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&rangeMacro);
              bVar8 = QString::endsWith((QString *)&r,(QChar)0x2c,CaseSensitive);
              if (bVar8) {
                QString::left((QString *)&rangeMacro,(QString *)&r,-0x5555555555555557);
                QVar6 = r;
                r.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
                            (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
                            rangeMacro.d.d.ptr;
                pFStack_90 = pFStack_b0;
                rangeMacro.d.d.ptr =
                     (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
                     (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)QVar6.d.d.ptr;
                pFStack_b0 = (Function *)&DAT_aaaaaaaaaaaaaaaa;
                local_88 = local_a8;
                local_a8 = &DAT_aaaaaaaaaaaaaaaa;
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&rangeMacro);
              }
              rangeMacro.d.d.ptr =
                   (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
                   ((ulong)rangeMacro.d.d.ptr & 0xffffffffffffff00);
              iVar9 = QString::toInt((QString *)&r,(bool *)&rangeMacro,10);
              if ((byte)rangeMacro.d.d.ptr == 0) {
                iVar9 = QString::toInt((QString *)&r,(bool *)&rangeMacro,0x10);
              }
              if (((byte)rangeMacro.d.d.ptr & 1) == 0) {
                iVar15 = QList<EnumNameValue>::begin((QList<EnumNameValue> *)&local_1e8);
                iVar16 = QList<EnumNameValue>::end((QList<EnumNameValue> *)&local_1e8);
                lVar19 = (long)iVar16.i - (long)iVar15.i;
                for (lVar24 = lVar19 / 0x38 >> 2; iVar18.i = iVar15.i, 0 < lVar24;
                    lVar24 = lVar24 + -1) {
                  bVar8 = comparesEqual(&(iVar15.i)->name,(QString *)&r);
                  if (bVar8) goto LAB_001084d5;
                  bVar8 = comparesEqual(&iVar15.i[1].name,(QString *)&r);
                  iVar18.i = iVar15.i + 1;
                  if (bVar8) goto LAB_001084d5;
                  bVar8 = comparesEqual(&iVar15.i[2].name,(QString *)&r);
                  iVar18.i = iVar15.i + 2;
                  if (bVar8) goto LAB_001084d5;
                  bVar8 = comparesEqual(&iVar15.i[3].name,(QString *)&r);
                  iVar18.i = iVar15.i + 3;
                  if (bVar8) goto LAB_001084d5;
                  iVar15.i = iVar15.i + 4;
                  lVar19 = lVar19 + -0xe0;
                }
                lVar19 = lVar19 / 0x38;
                if (lVar19 == 1) {
LAB_0010855b:
                  bVar8 = comparesEqual(&(iVar15.i)->name,(QString *)&r);
                  iVar18 = iVar16;
                  if (bVar8) {
                    iVar18.i = iVar15.i;
                  }
                }
                else if (lVar19 == 2) {
LAB_00108529:
                  bVar8 = comparesEqual(&(iVar18.i)->name,(QString *)&r);
                  if (!bVar8) {
                    iVar15.i = iVar18.i + 1;
                    goto LAB_0010855b;
                  }
                }
                else {
                  iVar18 = iVar16;
                  if ((lVar19 == 3) &&
                     (bVar8 = comparesEqual(&(iVar15.i)->name,(QString *)&r), iVar18.i = iVar15.i,
                     !bVar8)) {
                    iVar18.i = iVar15.i + 1;
                    goto LAB_00108529;
                  }
                }
LAB_001084d5:
                iVar15 = QList<EnumNameValue>::end((QList<EnumNameValue> *)&local_1e8);
                iVar9 = iVar10;
                if (iVar18.i != iVar15.i) {
                  iVar9 = (iVar18.i)->value;
                  goto LAB_001084ea;
                }
              }
              else {
LAB_001084ea:
                local_48 = (Data *)CONCAT44(local_48._4_4_,iVar9);
                QList<EnumNameValue>::emplaceBack<EnumNameValue_const&>
                          ((QList<EnumNameValue> *)&local_1e8,
                           (EnumNameValue *)&stack0xffffffffffffff88);
              }
              QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&r);
              iVar10 = iVar9;
            }
            else {
              bVar8 = QString::endsWith(pQVar20,(QChar)0x2c,CaseSensitive);
              if (bVar8) {
                QString::left((QString *)&r,pQVar20,(pQVar20->d).size + -1);
                puVar1 = local_68;
                pFVar22 = (Function *)pcStack_70;
                QVar2.d.ptr = local_78.d.ptr;
                local_78.d.ptr =
                     (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)
                     (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)r.d.d.ptr;
                pcStack_70 = (char16_t *)pFStack_90;
                r.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
                            (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
                            QVar2.d.ptr;
                pFStack_90 = pFVar22;
                local_68 = local_88;
                local_88 = puVar1;
                QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&r);
              }
              else {
                QString::operator=((QString *)&stack0xffffffffffffff88,pQVar20);
              }
              iVar10 = iVar10 + 1;
              local_48 = (Data *)CONCAT44(local_48._4_4_,iVar10);
              QList<EnumNameValue>::emplaceBack<EnumNameValue_const&>
                        ((QList<EnumNameValue> *)&local_1e8,
                         (EnumNameValue *)&stack0xffffffffffffff88);
            }
            EnumNameValue::~EnumNameValue((EnumNameValue *)&stack0xffffffffffffff88);
          }
          if (local_158 != (QString *)0x0) {
            uVar11 = 0;
LAB_00108594:
            if (uVar11 < (ulong)local_158 >> 1) {
              iVar15 = QList<EnumNameValue>::begin((QList<EnumNameValue> *)&local_1e8);
              iVar16 = QList<EnumNameValue>::end((QList<EnumNameValue> *)&local_1e8);
              lVar19 = uVar11 * 2 + 1;
              for (; iVar15.i != iVar16.i; iVar15.i = iVar15.i + 1) {
                pQVar17 = QList<QString>::data((QList<QString> *)&stack0xfffffffffffffe98);
                bVar8 = comparesEqual(&(iVar15.i)->name,pQVar17 + uVar11 * 2);
                if (bVar8) {
                  local_68 = &DAT_aaaaaaaaaaaaaaaa;
                  local_78.d.ptr =
                       (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)
                       &DAT_aaaaaaaaaaaaaaaa;
                  pcStack_70 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                  pQVar17 = QList<QString>::data((QList<QString> *)&stack0xfffffffffffffe98);
                  local_78.d.ptr =
                       (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)
                       pQVar17[lVar19].d.d;
                  pcStack_70 = pQVar17[lVar19].d.ptr;
                  local_68 = (undefined1 *)pQVar17[lVar19].d.size;
                  if (local_78.d.ptr != (QRegularExpressionMatchIteratorPrivate *)0x0) {
                    LOCK();
                    (((QArrayData *)
                     &((QRegularExpressionMatchIteratorPrivate *)local_78.d.ptr)->super_QSharedData)
                    ->ref_)._q_value.super___atomic_base<int>._M_i =
                         (((QArrayData *)
                          &((QRegularExpressionMatchIteratorPrivate *)local_78.d.ptr)->
                           super_QSharedData)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
                    UNLOCK();
                  }
                  iVar16 = QList<EnumNameValue>::begin((QList<EnumNameValue> *)&local_1e8);
                  iVar18 = QList<EnumNameValue>::end((QList<EnumNameValue> *)&local_1e8);
                  lVar19 = (long)iVar18.i - (long)iVar16.i;
                  lVar24 = lVar19 / 0x38 >> 2;
                  goto LAB_001086ce;
                }
              }
              pQVar17 = QList<QString>::data((QList<QString> *)&stack0xfffffffffffffe98);
              QString::toLocal8Bit((QByteArray *)&stack0xffffffffffffff88,pQVar17 + uVar11 * 2);
              pFVar22 = (Function *)pcStack_70;
              if ((Function *)pcStack_70 == (Function *)0x0) {
                pFVar22 = (Function *)"";
              }
              panic("Unable to find range begin: %s\n",pFVar22);
              QArrayDataPointer<char>::~QArrayDataPointer
                        ((QArrayDataPointer<char> *)&stack0xffffffffffffff88);
              goto LAB_00108937;
            }
          }
          iVar15 = QList<EnumNameValue>::begin((QList<EnumNameValue> *)&local_1e8);
          iVar16 = QList<EnumNameValue>::end((QList<EnumNameValue> *)&local_1e8);
          if (iVar15.i != iVar16.i) {
            uVar11 = ((long)iVar16.i - (long)iVar15.i) / 0x38;
            lVar19 = 0x3f;
            if (uVar11 != 0) {
              for (; uVar11 >> lVar19 == 0; lVar19 = lVar19 + -1) {
              }
            }
            std::
            __introsort_loop<QList<EnumNameValue>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<Parser::parseMetadata(QString_const&,long_long,QList<QString>const&)::__1>>
                      (iVar15.i,iVar16.i,((uint)lVar19 ^ 0x3f) * 2 ^ 0x7e);
            if ((long)iVar16.i - (long)iVar15.i < 0x381) {
              std::
              __insertion_sort<QList<EnumNameValue>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<Parser::parseMetadata(QString_const&,long_long,QList<QString>const&)::__1>>
                        (iVar15.i,iVar16.i);
            }
            else {
              pEVar25 = iVar15.i + 0x10;
              std::
              __insertion_sort<QList<EnumNameValue>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<Parser::parseMetadata(QString_const&,long_long,QList<QString>const&)::__1>>
                        (iVar15.i,pEVar25);
              for (; pEVar25 != iVar16.i; pEVar25 = pEVar25 + 1) {
                std::
                __unguarded_linear_insert<QList<EnumNameValue>::iterator,__gnu_cxx::__ops::_Val_comp_iter<Parser::parseMetadata(QString_const&,long_long,QList<QString>const&)::__1>>
                          (pEVar25);
              }
            }
          }
          QList<QString>::clear((QList<QString> *)&local_1c8);
          iVar10 = (local_1e8.ptr)->value;
          pQVar20 = &(local_1e8.ptr)->valueStr;
          for (lVar19 = local_1e8.size * 0x38; lVar19 != 0; lVar19 = lVar19 + -0x38) {
            local_68 = (undefined1 *)0x0;
            local_78.d.ptr =
                 (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)
                 (QRegularExpressionMatchIteratorPrivate *)0x0;
            pcStack_70 = (char16_t *)0x0;
            if ((pQVar20->d).ptr == (char16_t *)0x0) {
              if (*(int *)(pQVar20 + 1) == iVar10 + 1 && !bVar7) {
                QString::operator=((QString *)&stack0xffffffffffffff88,pQVar20 + -1);
              }
              else {
                local_218.d = (Data *)0x0;
                local_218.ptr = (char16_t *)0x0;
                local_200.d = (Data *)0x0;
                local_200.ptr = L"%1 = %2";
                local_218.size = 0;
                local_200.size = 7;
                QString::arg<QString,_true>
                          ((QString *)&rangeMacro,(QString *)&local_200,(QString *)(pQVar20 + -1),0,
                           (QChar)0x20);
                QString::arg<int,_true>
                          ((QString *)&r,(QString *)&rangeMacro,*(int *)(pQVar20 + 1),0,10,
                           (QChar)0x20);
                puVar1 = local_68;
                pFVar22 = (Function *)pcStack_70;
                QVar2.d.ptr = local_78.d.ptr;
                local_78.d.ptr =
                     (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)
                     (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)r.d.d.ptr;
                pcStack_70 = (char16_t *)pFStack_90;
                r.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
                            (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
                            QVar2.d.ptr;
                pFStack_90 = pFVar22;
                local_68 = local_88;
                local_88 = puVar1;
                QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&r);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&rangeMacro);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_200);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_218);
              }
              iVar10 = *(int *)(pQVar20 + 1);
            }
            else {
              QString::operator=((QString *)&stack0xffffffffffffff88,pQVar20);
            }
            QList<QString>::emplaceBack<QString_const&>
                      ((QList<QString> *)&local_1c8,(QString *)&stack0xffffffffffffff88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff88);
            pQVar20 = (QString *)&pQVar20[2].d.ptr;
          }
          local_218.d = (Data *)0x0;
          local_218.ptr = (char16_t *)0x0;
          local_200.d = (Data *)0x0;
          local_200.ptr = L"%1 {\n %2 \n} %3;";
          local_218.size = 0;
          local_200.size = 0xf;
          QString::arg<QString,_true>
                    ((QString *)&rangeMacro,(QString *)&local_200,(QString *)&rm,0,(QChar)0x20);
          local_260.d = (Data *)0x0;
          local_260.ptr = (char16_t *)0x0;
          local_248.d = (Data *)0x0;
          local_248.ptr = L",\n";
          local_260.size = 0;
          local_248.size = 2;
          QListSpecialMethods<QString>::join
                    ((QString *)&local_230,(QListSpecialMethods<QString> *)&local_1c8,
                     (QString *)&local_248);
          QString::arg<QString,_true>
                    ((QString *)&r,(QString *)&rangeMacro,(QString *)&local_230,0,(QChar)0x20);
          QString::arg<QString,_true>
                    ((QString *)&stack0xffffffffffffff88,(QString *)&r,(QString *)local_1a8,0,
                     (QChar)0x20);
          qVar5 = local_d8.size;
          pcVar4 = local_d8.ptr;
          pDVar3 = local_d8.d;
          local_d8.d = (Data *)local_78.d.ptr;
          local_d8.ptr = pcStack_70;
          local_78.d.ptr =
               (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)
               (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)pDVar3;
          pcStack_70 = pcVar4;
          local_d8.size = (qsizetype)local_68;
          local_68 = (undefined1 *)qVar5;
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&r);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_230);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_248);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_260);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&rangeMacro);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_200);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_218);
          bVar7 = QListSpecialMethods<QString>::contains
                            ((QListSpecialMethods<QString> *)this_00,(QString *)&local_d8,
                             CaseSensitive);
          if (!bVar7) {
            QList<QString>::emplaceBack<QString_const&>(this_00,(QString *)&local_d8);
          }
          QArrayDataPointer<EnumNameValue>::~QArrayDataPointer(&local_1e8);
        }
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_1c8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_1a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&rm);
        QArrayDataPointer<QString>::~QArrayDataPointer
                  ((QArrayDataPointer<QString> *)&stack0xfffffffffffffe98);
      }
      else {
        r.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
                    (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)0x0;
        local_78.d.ptr =
             (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)
             (QRegularExpressionMatchIteratorPrivate *)0x0;
        pcStack_70 = L"AUTO";
        local_68 = (undefined1 *)0x4;
        bVar7 = QString::startsWith((QString *)&stack0xfffffffffffffeb8,
                                    (QString *)&stack0xffffffffffffff88,CaseSensitive);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&r);
        if (bVar7) goto LAB_00107e1b;
        QRegularExpressionMatch::captured((QString *)&stack0xffffffffffffff88,&match,0);
        bVar7 = QListSpecialMethods<QString>::contains
                          ((QListSpecialMethods<QString> *)this_00,
                           (QString *)&stack0xffffffffffffff88,CaseSensitive);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff88);
        if (!bVar7) {
          QRegularExpressionMatch::captured((QString *)&stack0xffffffffffffff88,&match,0);
          QList<QString>::emplaceBack<QString>(this_00,(QString *)&stack0xffffffffffffff88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff88);
        }
      }
      local_288 = qVar13 + 1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&stack0xfffffffffffffeb8);
      QRegularExpressionMatch::~QRegularExpressionMatch(&match);
    }
    if ((long)local_108 - local_288 != 0 && local_288 <= (long)local_108) {
      QString::mid((QString *)&stack0xffffffffffffff88,(QString *)&stack0xfffffffffffffee8,local_288
                   ,(long)local_108 - local_288);
      QList<QString>::emplaceBack<QString>(this_00,(QString *)&stack0xffffffffffffff88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff88);
    }
    QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator(&i);
    QRegularExpression::~QRegularExpression(&macro);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&stack0xfffffffffffffee8);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff08);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
LAB_001086ce:
  if (lVar24 < 1) goto LAB_00108748;
  bVar8 = comparesEqual(&(iVar16.i)->name,(QString *)&stack0xffffffffffffff88);
  s1.i = iVar16.i;
  if (bVar8) goto LAB_001087b9;
  s1.i = iVar16.i + 1;
  bVar8 = comparesEqual(&(s1.i)->name,(QString *)&stack0xffffffffffffff88);
  if (bVar8) goto LAB_001087b9;
  s1.i = iVar16.i + 2;
  bVar8 = comparesEqual(&(s1.i)->name,(QString *)&stack0xffffffffffffff88);
  if (bVar8) goto LAB_001087b9;
  s1.i = iVar16.i + 3;
  bVar8 = comparesEqual(&(s1.i)->name,(QString *)&stack0xffffffffffffff88);
  if (bVar8) goto LAB_001087b9;
  iVar16.i = iVar16.i + 4;
  lVar24 = lVar24 + -1;
  lVar19 = lVar19 + -0xe0;
  goto LAB_001086ce;
LAB_00108748:
  lVar19 = lVar19 / 0x38;
  if (lVar19 != 1) {
    if (lVar19 != 2) {
      s1 = iVar18;
      if ((lVar19 != 3) ||
         (bVar8 = comparesEqual(&(iVar16.i)->name,(QString *)&stack0xffffffffffffff88),
         s1.i = iVar16.i, bVar8)) goto LAB_001087b9;
      iVar16.i = iVar16.i + 1;
    }
    bVar8 = comparesEqual(&(iVar16.i)->name,(QString *)&stack0xffffffffffffff88);
    s1.i = iVar16.i;
    if (bVar8) goto LAB_001087b9;
    iVar16.i = iVar16.i + 1;
  }
  bVar8 = comparesEqual(&(iVar16.i)->name,(QString *)&stack0xffffffffffffff88);
  s1 = iVar18;
  if (bVar8) {
    s1.i = iVar16.i;
  }
LAB_001087b9:
  iVar16 = QList<EnumNameValue>::end((QList<EnumNameValue> *)&local_1e8);
  if (s1.i == iVar16.i) {
    QString::toLocal8Bit((QByteArray *)&r,(QString *)&stack0xffffffffffffff88);
    pcVar23 = (char *)pFStack_90;
    if (pFStack_90 == (Function *)0x0) {
      pcVar23 = "";
    }
    panic("Unable to find range end: %s\n",pcVar23);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&r);
  }
  else {
    local_230.d = (Data *)0x0;
    local_230.ptr = (char16_t *)0x0;
    local_218.d = (Data *)0x0;
    local_218.ptr = L"RANGE(%1, %2 ... %3)";
    local_230.size = 0;
    local_218.size = 0x14;
    QString::arg<QString,_true>
              ((QString *)&local_200,(QString *)&local_218,&(iVar15.i)->name,0,(QChar)0x20);
    QString::arg<int,_true>
              ((QString *)&rangeMacro,(QString *)&local_200,(iVar15.i)->value,0,10,(QChar)0x20);
    QString::arg<int,_true>((QString *)&r,(QString *)&rangeMacro,(s1.i)->value,0,10,(QChar)0x20);
    QVar2.d.ptr = (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)
                  ((iVar15.i)->valueStr).d.d;
    pFVar22 = (Function *)((iVar15.i)->valueStr).d.ptr;
    ((iVar15.i)->valueStr).d.d = (Data *)r.d.d.ptr;
    ((iVar15.i)->valueStr).d.ptr = (char16_t *)pFStack_90;
    puVar1 = (undefined1 *)((iVar15.i)->valueStr).d.size;
    ((iVar15.i)->valueStr).d.size = (qsizetype)local_88;
    r.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
                (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)QVar2.d.ptr;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&r);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&rangeMacro);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_200);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_218);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_230);
    pFStack_90 = pFVar22;
    local_88 = puVar1;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff88);
LAB_00108937:
  uVar11 = uVar11 + 1;
  goto LAB_00108594;
}

Assistant:

void Parser::parseMetadata(const QString &data, qsizetype offset, const QStringList &includes)
{
    qsizetype beginOfProvider = data.indexOf(QLatin1Char('('), offset);
    qsizetype endOfProvider = data.indexOf(QLatin1Char(','), beginOfProvider);
    QString metadata;
    QString provider = data.mid(beginOfProvider + 1, endOfProvider - beginOfProvider - 1).simplified();
    if (provider != m_provider)
        return;

    qsizetype endOfPoint = data.indexOf(QLatin1Char(')'), endOfProvider + 1);
    metadata = data.mid(endOfProvider + 1, endOfPoint - endOfProvider - 1).simplified();

    DEBUGPRINTF(printf("tracepointgen: metadata: %s", qPrintable(metadata)));

    QString preprocessed = preprocessMetadata(metadata);

    DEBUGPRINTF2(printf("preprocessed %s\n", qPrintable(preprocessed)));

    QRegularExpression macro(QStringLiteral("([A-Z]*) ?{ ?([A-Za-z0-9=_,. ]*) ?} ?([A-Za-z0-9_:]*) ?;"));
    QRegularExpressionMatchIterator i = macro.globalMatch(preprocessed);
    qsizetype prev = 0;
    while (i.hasNext()) {
        QRegularExpressionMatch match = i.next();
        QString values = match.captured(2).trimmed();
        int cur = match.capturedStart();
        if (cur > prev)
            m_metadata.append(preprocessed.mid(prev, cur - prev));

        prev = match.capturedEnd() + 1;
        DEBUGPRINTF2(printf("values: %s\n", qPrintable(values)));
        if (values.isEmpty() || values.startsWith(QStringLiteral("AUTO"))) {
            values.replace(QLatin1Char('\n'), QLatin1Char(' '));
            QStringList ranges;
            if (values.contains(QStringLiteral("RANGE"))) {
                QRegularExpression rangeMacro(QStringLiteral("RANGE +([A-Za-z0-9_]*) +... +([A-Za-z0-9_]*)"));
                QRegularExpressionMatchIterator r = rangeMacro.globalMatch(values);
                while (r.hasNext()) {
                    QRegularExpressionMatch rm = r.next();
                    ranges << rm.captured(1);
                    ranges << rm.captured(2);
                    DEBUGPRINTF2(printf("range: %s ... %s\n", qPrintable(rm.captured(1)), qPrintable(rm.captured(2))));
                }
            }

            const auto enumOrFlag = match.captured(1);
            const auto name = match.captured(3);
            const bool flags = enumOrFlag == QStringLiteral("FLAGS");

            QStringList values = findEnumValues(name, includes);
            if (values.isEmpty()) {
                if (flags && name.endsWith(QLatin1Char('s')))
                    values = findEnumValues(name.left(name.length() - 1), includes);
                if (values.isEmpty()) {
                    DEBUGPRINTF(printf("Unable to find values for %s\n", qPrintable(name)));
                }
            }
            if (!values.isEmpty()) {
                auto moreValues = enumsToValues(values);
                if (ranges.size()) {
                    for (int i = 0; i < ranges.size() / 2; i++) {
                        bool rangeFound = false;
                        for (auto &v : moreValues) {
                            if (v.name == ranges[2 * i]) {
                                rangeFound = true;
                                QString rangeEnd = ranges[2 * i + 1];
                                auto iter = std::find_if(moreValues.begin(), moreValues.end(), [&rangeEnd](const EnumNameValue &elem){
                                    return elem.name == rangeEnd;
                                });
                                if (iter != moreValues.end())
                                    v.valueStr = QStringLiteral("RANGE(%1, %2 ... %3)").arg(v.name).arg(v.value).arg(iter->value);
                                else
                                    panic("Unable to find range end: %s\n", qPrintable(rangeEnd));
                                break;
                            }
                        }
                        if (rangeFound == false)
                            panic("Unable to find range begin: %s\n", qPrintable(ranges[2 * i]));
                    }
                }
                std::sort(moreValues.begin(), moreValues.end(), [](const EnumNameValue &a, const EnumNameValue &b) {
                    return a.value < b.value;
                });
                values.clear();
                int prevValue = std::as_const(moreValues).front().value;
                for (const auto &v : std::as_const(moreValues)) {
                    QString a;
                    if (v.valueStr.isNull()) {
                        if (v.value == prevValue + 1 && !flags)
                            a = v.name;
                        else
                            a = QStringLiteral("%1 = %2").arg(v.name).arg(v.value);
                        prevValue = v.value;
                    } else {
                        a = v.valueStr;
                    }
                    values << a;
                }

                metadata = QStringLiteral("%1 {\n %2 \n} %3;").arg(enumOrFlag).arg(values.join(QStringLiteral(",\n"))).arg(name);
                if (!m_metadata.contains(metadata))
                    m_metadata.append(metadata);
            }
        } else {
            if (!m_metadata.contains(match.captured()))
                m_metadata.append(match.captured());
        }
    }
    if (prev < preprocessed.length())
        m_metadata.append(preprocessed.mid(prev, preprocessed.length() - prev));
}